

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

void PredictorAdd12_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  undefined1 (*pauVar1) [16];
  undefined8 *puVar2;
  undefined4 uVar3;
  char cVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [13];
  undefined1 auVar10 [11];
  undefined1 auVar11 [15];
  undefined1 auVar12 [13];
  undefined1 auVar13 [11];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  byte bVar18;
  byte bVar20;
  short sVar19;
  byte bVar21;
  byte bVar23;
  short sVar22;
  byte bVar24;
  byte bVar26;
  short sVar25;
  byte bVar27;
  byte bVar29;
  short sVar28;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  __m128i res_3;
  __m128i alls_3;
  __m128i all_3;
  __m128i res_2;
  __m128i alls_2;
  __m128i all_2;
  __m128i res_1;
  __m128i alls_1;
  __m128i all_1;
  __m128i res;
  __m128i alls;
  __m128i all;
  __m128i diff_hi;
  __m128i diff_lo;
  __m128i TL_hi;
  __m128i TL_lo;
  __m128i TL;
  __m128i T_hi;
  __m128i T_lo;
  __m128i T;
  __m128i src;
  __m128i L;
  __m128i L8;
  __m128i zero;
  int i;
  undefined1 local_418 [16];
  int local_3dc;
  byte local_318;
  byte bStack_317;
  byte bStack_316;
  byte bStack_315;
  byte bStack_314;
  byte bStack_313;
  byte bStack_312;
  byte bStack_311;
  byte local_2f8;
  byte bStack_2f7;
  byte bStack_2f6;
  byte bStack_2f5;
  byte bStack_2f4;
  byte bStack_2f3;
  byte bStack_2f2;
  byte bStack_2f1;
  ushort uStack_296;
  ushort uStack_294;
  ushort uStack_292;
  ushort uStack_290;
  ushort uStack_28e;
  ushort uStack_28c;
  ushort uStack_28a;
  ushort uStack_276;
  ushort uStack_274;
  ushort uStack_272;
  ushort uStack_270;
  ushort uStack_26e;
  ushort uStack_26c;
  ushort uStack_26a;
  ushort uStack_256;
  ushort uStack_254;
  ushort uStack_252;
  ushort uStack_250;
  ushort uStack_24e;
  ushort uStack_24c;
  ushort uStack_24a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  ushort uStack_126;
  ushort uStack_124;
  ushort uStack_122;
  ushort uStack_11e;
  ushort uStack_11c;
  ushort uStack_11a;
  ushort uStack_116;
  ushort uStack_114;
  ushort uStack_112;
  ushort uStack_10e;
  ushort uStack_10c;
  ushort uStack_10a;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  ushort uStack_fe;
  ushort uStack_fc;
  ushort uStack_fa;
  ushort uStack_f6;
  ushort uStack_f4;
  ushort uStack_f2;
  ushort uStack_ee;
  ushort uStack_ec;
  ushort uStack_ea;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  byte bStack_30;
  byte bStack_2f;
  byte bStack_2e;
  byte bStack_2d;
  byte bStack_2c;
  byte bStack_2b;
  byte bStack_2a;
  byte bStack_29;
  byte bStack_10;
  byte bStack_f;
  byte bStack_e;
  byte bStack_d;
  byte bStack_c;
  byte bStack_b;
  byte bStack_a;
  byte bStack_9;
  
  uVar3 = *(undefined4 *)(in_RCX + -4);
  auVar10._1_9_ = (unkuint9)0 << 8;
  auVar10[0] = (char)((uint)uVar3 >> 0x18);
  auVar10[10] = 0;
  auVar9._1_11_ = auVar10 << 8;
  auVar9[0] = (char)((uint)uVar3 >> 0x10);
  auVar9[0xc] = 0;
  local_418._3_13_ = auVar9 << 8;
  local_418[2] = (char)((uint)uVar3 >> 8);
  local_418[0] = (byte)uVar3;
  local_418[1] = 0;
  for (local_3dc = 0; local_3dc + 4 <= in_EDX; local_3dc = local_3dc + 4) {
    pauVar1 = (undefined1 (*) [16])(in_RDI + (long)local_3dc * 4);
    uVar5 = *(undefined8 *)*pauVar1;
    auVar8 = *pauVar1;
    puVar2 = (undefined8 *)(in_RSI + (long)local_3dc * 4);
    uVar6 = *puVar2;
    uVar7 = puVar2[1];
    local_2f8 = (byte)uVar6;
    bStack_2f7 = (byte)((ulong)uVar6 >> 8);
    bStack_2f6 = (byte)((ulong)uVar6 >> 0x10);
    bStack_2f5 = (byte)((ulong)uVar6 >> 0x18);
    bStack_2f4 = (byte)((ulong)uVar6 >> 0x20);
    bStack_2f3 = (byte)((ulong)uVar6 >> 0x28);
    bStack_2f2 = (byte)((ulong)uVar6 >> 0x30);
    bStack_2f1 = (byte)((ulong)uVar6 >> 0x38);
    bStack_10 = (byte)uVar7;
    bStack_f = (byte)((ulong)uVar7 >> 8);
    bStack_e = (byte)((ulong)uVar7 >> 0x10);
    bStack_d = (byte)((ulong)uVar7 >> 0x18);
    bStack_c = (byte)((ulong)uVar7 >> 0x20);
    bStack_b = (byte)((ulong)uVar7 >> 0x28);
    bStack_a = (byte)((ulong)uVar7 >> 0x30);
    bStack_9 = (byte)((ulong)uVar7 >> 0x38);
    puVar2 = (undefined8 *)(in_RSI + (long)(local_3dc + -1) * 4);
    uVar6 = *puVar2;
    uVar7 = puVar2[1];
    local_318 = (byte)uVar6;
    bStack_317 = (byte)((ulong)uVar6 >> 8);
    bStack_316 = (byte)((ulong)uVar6 >> 0x10);
    bStack_315 = (byte)((ulong)uVar6 >> 0x18);
    bStack_314 = (byte)((ulong)uVar6 >> 0x20);
    bStack_313 = (byte)((ulong)uVar6 >> 0x28);
    bStack_312 = (byte)((ulong)uVar6 >> 0x30);
    bStack_311 = (byte)((ulong)uVar6 >> 0x38);
    bStack_30 = (byte)uVar7;
    bStack_2f = (byte)((ulong)uVar7 >> 8);
    bStack_2e = (byte)((ulong)uVar7 >> 0x10);
    bStack_2d = (byte)((ulong)uVar7 >> 0x18);
    bStack_2c = (byte)((ulong)uVar7 >> 0x20);
    bStack_2b = (byte)((ulong)uVar7 >> 0x28);
    bStack_2a = (byte)((ulong)uVar7 >> 0x30);
    bStack_29 = (byte)((ulong)uVar7 >> 0x38);
    uStack_f6 = (ushort)bStack_2f7;
    uStack_f4 = (ushort)bStack_2f6;
    uStack_f2 = (ushort)bStack_2f5;
    uStack_ee = (ushort)bStack_2f3;
    uStack_ec = (ushort)bStack_2f2;
    uStack_ea = (ushort)bStack_2f1;
    uStack_106 = (ushort)bStack_317;
    uStack_104 = (ushort)bStack_316;
    uStack_102 = (ushort)bStack_315;
    uStack_fe = (ushort)bStack_313;
    uStack_fc = (ushort)bStack_312;
    uStack_fa = (ushort)bStack_311;
    uStack_116 = (ushort)bStack_f;
    uStack_114 = (ushort)bStack_e;
    uStack_112 = (ushort)bStack_d;
    uStack_10e = (ushort)bStack_b;
    uStack_10c = (ushort)bStack_a;
    uStack_10a = (ushort)bStack_9;
    uStack_126 = (ushort)bStack_2f;
    uStack_124 = (ushort)bStack_2e;
    uStack_122 = (ushort)bStack_2d;
    uStack_11e = (ushort)bStack_2b;
    uStack_11c = (ushort)bStack_2a;
    uStack_11a = (ushort)bStack_29;
    local_238 = local_418._0_2_;
    sStack_236 = local_418._2_2_;
    sStack_234 = local_418._4_2_;
    sStack_232 = local_418._6_2_;
    sStack_230 = local_418._8_2_;
    sStack_22e = local_418._10_2_;
    sStack_22c = local_418._12_2_;
    sStack_22a = local_418._14_2_;
    local_238 = local_238 + ((ushort)local_2f8 - (ushort)local_318);
    sStack_236 = sStack_236 + (uStack_f6 - uStack_106);
    sStack_234 = sStack_234 + (uStack_f4 - uStack_104);
    sStack_232 = sStack_232 + (uStack_f2 - uStack_102);
    sStack_230 = sStack_230 + ((ushort)bStack_2f4 - (ushort)bStack_314);
    sStack_22e = sStack_22e + (uStack_ee - uStack_fe);
    sStack_22c = sStack_22c + (uStack_ec - uStack_fc);
    sStack_22a = sStack_22a + (uStack_ea - uStack_fa);
    local_58 = (char)uVar5;
    cStack_57 = (char)((ulong)uVar5 >> 8);
    cStack_56 = (char)((ulong)uVar5 >> 0x10);
    cStack_55 = (char)((ulong)uVar5 >> 0x18);
    cStack_54 = (char)((ulong)uVar5 >> 0x20);
    cStack_53 = (char)((ulong)uVar5 >> 0x28);
    cStack_52 = (char)((ulong)uVar5 >> 0x30);
    cStack_51 = (char)((ulong)uVar5 >> 0x38);
    bVar18 = local_58 +
             ((0 < local_238) * (local_238 < 0x100) * (char)local_238 - (0xff < local_238));
    bVar20 = cStack_57 +
             ((0 < sStack_236) * (sStack_236 < 0x100) * (char)sStack_236 - (0xff < sStack_236));
    bVar21 = cStack_56 +
             ((0 < sStack_234) * (sStack_234 < 0x100) * (char)sStack_234 - (0xff < sStack_234));
    bVar23 = cStack_55 +
             ((0 < sStack_232) * (sStack_232 < 0x100) * (char)sStack_232 - (0xff < sStack_232));
    bVar24 = cStack_54 +
             ((0 < sStack_230) * (sStack_230 < 0x100) * (char)sStack_230 - (0xff < sStack_230));
    bVar26 = cStack_53 +
             ((0 < sStack_22e) * (sStack_22e < 0x100) * (char)sStack_22e - (0xff < sStack_22e));
    bVar27 = cStack_52 +
             ((0 < sStack_22c) * (sStack_22c < 0x100) * (char)sStack_22c - (0xff < sStack_22c));
    bVar29 = cStack_51 +
             ((0 < sStack_22a) * (sStack_22a < 0x100) * (char)sStack_22a - (0xff < sStack_22a));
    *(uint *)(in_RCX + (long)local_3dc * 4) =
         CONCAT13(bVar23,CONCAT12(bVar21,CONCAT11(bVar20,bVar18)));
    uStack_256 = (ushort)bVar20;
    uStack_254 = (ushort)bVar21;
    uStack_252 = (ushort)bVar23;
    uStack_250 = (ushort)bVar24;
    uStack_24e = (ushort)bVar26;
    uStack_24c = (ushort)bVar27;
    uStack_24a = (ushort)bVar29;
    sVar19 = (ushort)bVar18 + ((ushort)bStack_2f4 - (ushort)bStack_314);
    sVar22 = uStack_256 + (uStack_ee - uStack_fe);
    sVar25 = uStack_254 + (uStack_ec - uStack_fc);
    sVar28 = uStack_252 + (uStack_ea - uStack_fa);
    local_78 = auVar8[4];
    cStack_77 = auVar8[5];
    cStack_76 = auVar8[6];
    cStack_75 = auVar8[7];
    cStack_74 = auVar8[8];
    cStack_73 = auVar8[9];
    cStack_72 = auVar8[10];
    cStack_71 = auVar8[0xb];
    bVar18 = local_78 + ((0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19));
    bVar20 = cStack_77 + ((0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22));
    bVar21 = cStack_76 + ((0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25));
    bVar23 = cStack_75 + ((0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28));
    *(uint *)(in_RCX + 4 + (long)local_3dc * 4) =
         CONCAT13(bVar23,CONCAT12(bVar21,CONCAT11(bVar20,bVar18)));
    uStack_276 = (ushort)bVar20;
    uStack_274 = (ushort)bVar21;
    uStack_272 = (ushort)bVar23;
    uStack_270 = (ushort)(byte)(cStack_74 +
                               ((bVar24 != 0) * (uStack_250 < 0x100) * bVar24 - (0xff < uStack_250))
                               );
    uStack_26e = (ushort)(byte)(cStack_73 +
                               ((bVar26 != 0) * (uStack_24e < 0x100) * bVar26 - (0xff < uStack_24e))
                               );
    uStack_26c = (ushort)(byte)(cStack_72 +
                               ((bVar27 != 0) * (uStack_24c < 0x100) * bVar27 - (0xff < uStack_24c))
                               );
    uStack_26a = (ushort)(byte)(cStack_71 +
                               ((bVar29 != 0) * (uStack_24a < 0x100) * bVar29 - (0xff < uStack_24a))
                               );
    sVar19 = (ushort)bVar18 + ((ushort)bStack_10 - (ushort)bStack_30);
    sVar22 = uStack_276 + (uStack_116 - uStack_126);
    sVar25 = uStack_274 + (uStack_114 - uStack_124);
    sVar28 = uStack_272 + (uStack_112 - uStack_122);
    sVar30 = uStack_270 + ((ushort)bStack_c - (ushort)bStack_2c);
    sVar31 = uStack_26e + (uStack_10e - uStack_11e);
    sVar32 = uStack_26c + (uStack_10c - uStack_11c);
    sVar33 = uStack_26a + (uStack_10a - uStack_11a);
    cStack_94 = auVar8[0xc];
    cStack_93 = auVar8[0xd];
    cStack_92 = auVar8[0xe];
    cStack_91 = auVar8[0xf];
    bVar18 = cStack_74 + ((0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19));
    bVar20 = cStack_73 + ((0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22));
    bVar21 = cStack_72 + ((0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25));
    bVar23 = cStack_71 + ((0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28));
    bVar24 = cStack_94 + ((0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30));
    bVar26 = cStack_93 + ((0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31));
    bVar27 = cStack_92 + ((0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32));
    bVar29 = cStack_91 + ((0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33));
    *(uint *)(in_RCX + 8 + (long)local_3dc * 4) =
         CONCAT13(bVar23,CONCAT12(bVar21,CONCAT11(bVar20,bVar18)));
    uStack_296 = (ushort)bVar20;
    uStack_294 = (ushort)bVar21;
    uStack_292 = (ushort)bVar23;
    uStack_290 = (ushort)bVar24;
    uStack_28e = (ushort)bVar26;
    uStack_28c = (ushort)bVar27;
    uStack_28a = (ushort)bVar29;
    sVar19 = (ushort)bVar18 + ((ushort)bStack_c - (ushort)bStack_2c);
    sVar22 = uStack_296 + (uStack_10e - uStack_11e);
    sVar25 = uStack_294 + (uStack_10c - uStack_11c);
    sVar28 = uStack_292 + (uStack_10a - uStack_11a);
    cVar4 = (bVar29 != 0) * (uStack_28a < 0x100) * bVar29 - (0xff < uStack_28a);
    auVar8[2] = (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
    auVar8[1] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    local_418[0] = cStack_94 + ((0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19));
    cStack_93 = cStack_93 + ((0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22));
    cStack_92 = cStack_92 + ((0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25));
    cStack_91 = cStack_91 + ((0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28));
    *(uint *)(in_RCX + 0xc + (long)local_3dc * 4) =
         CONCAT13(cStack_91,CONCAT12(cStack_92,CONCAT11(cStack_93,local_418[0])));
    auVar8[3] = (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25);
    auVar8[4] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
    auVar8[5] = (bVar24 != 0) * (uStack_290 < 0x100) * bVar24 - (0xff < uStack_290);
    auVar8[6] = (bVar26 != 0) * (uStack_28e < 0x100) * bVar26 - (0xff < uStack_28e);
    auVar8[7] = (bVar27 != 0) * (uStack_28c < 0x100) * bVar27 - (0xff < uStack_28c);
    auVar8[8] = (bVar29 != 0) * (uStack_28a < 0x100) * bVar29 - (0xff < uStack_28a);
    auVar8[0] = cVar4;
    auVar8._9_7_ = 0;
    auVar8 = auVar8 << 0x38;
    auVar11[0xd] = 0;
    auVar11._0_13_ = auVar8._0_13_;
    auVar11[0xe] = cVar4;
    auVar14[0xc] = (bVar27 != 0) * (uStack_28c < 0x100) * bVar27 - (0xff < uStack_28c);
    auVar14._0_12_ = auVar8._0_12_;
    auVar14._13_2_ = auVar11._13_2_;
    auVar15[0xb] = 0;
    auVar15._0_11_ = auVar8._0_11_;
    auVar15._12_3_ = auVar14._12_3_;
    auVar16[10] = (bVar26 != 0) * (uStack_28e < 0x100) * bVar26 - (0xff < uStack_28e);
    auVar16._0_10_ = auVar8._0_10_;
    auVar16._11_4_ = auVar15._11_4_;
    auVar17[9] = 0;
    auVar17._0_9_ = auVar8._0_9_;
    auVar17._10_5_ = auVar16._10_5_;
    auVar13._1_9_ =
         (unkuint9)
         (uint7)(CONCAT62(auVar17._9_6_,
                          CONCAT11((bVar24 != 0) * (uStack_290 < 0x100) * bVar24 -
                                   (0xff < uStack_290),cVar4)) >> 8) << 8;
    auVar13[0] = cStack_91;
    auVar13[10] = 0;
    auVar12._1_11_ = auVar13 << 8;
    auVar12[0] = cStack_92;
    auVar12[0xc] = 0;
    local_418._3_13_ = auVar12 << 8;
    local_418[2] = cStack_93;
    local_418[1] = 0;
  }
  if (local_3dc != in_EDX) {
    (*VP8LPredictorsAdd_C[0xc])
              ((uint32_t *)(in_RDI + (long)local_3dc * 4),(uint32_t *)(in_RSI + (long)local_3dc * 4)
               ,in_EDX - local_3dc,(uint32_t *)(in_RCX + (long)local_3dc * 4));
  }
  return;
}

Assistant:

static void PredictorAdd12_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* out) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  const __m128i L8 = _mm_cvtsi32_si128(out[-1]);
  __m128i L = _mm_unpacklo_epi8(L8, zero);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    // Load 4 pixels at a time.
    __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i T_lo = _mm_unpacklo_epi8(T, zero);
    const __m128i T_hi = _mm_unpackhi_epi8(T, zero);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i TL_lo = _mm_unpacklo_epi8(TL, zero);
    const __m128i TL_hi = _mm_unpackhi_epi8(TL, zero);
    __m128i diff_lo = _mm_sub_epi16(T_lo, TL_lo);
    __m128i diff_hi = _mm_sub_epi16(T_hi, TL_hi);
    DO_PRED12(diff_lo, 0, 0);
    DO_PRED12_SHIFT(diff_lo, 0);
    DO_PRED12(diff_lo, 1, 1);
    DO_PRED12_SHIFT(diff_lo, 1);
    DO_PRED12(diff_hi, 0, 2);
    DO_PRED12_SHIFT(diff_hi, 0);
    DO_PRED12(diff_hi, 1, 3);
  }
  if (i != num_pixels) {
    VP8LPredictorsAdd_C[12](in + i, upper + i, num_pixels - i, out + i);
  }
}